

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_connection::on_connection_complete(peer_connection *this,error_code *e)

{
  time_point reference;
  session_interface *psVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  element_type *this_00;
  ulong uVar5;
  error_category *cat;
  undefined8 uVar6;
  __shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar7;
  endpoint *ep;
  shared_ptr<libtorrent::peer_plugin> *ext;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
  *__range2;
  uint local_110;
  undefined1 local_109;
  int value;
  endpoint_type local_f8;
  undefined1 local_d9;
  string local_d8;
  undefined1 local_b1;
  error_code local_b0;
  undefined1 local_99;
  address local_98;
  undefined1 local_75;
  endpoint_type local_74;
  undefined1 local_58 [8];
  error_code ec;
  undefined1 local_28 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  error_code *e_local;
  peer_connection *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)e;
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_28);
  if (((byte)(this->super_peer_connection_hot_members).field_0x28 >> 1 & 1) != 0) {
    counters::inc_stats_counter(this->m_counters,0xe5,-1);
    bVar3 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
    if (bVar3) {
      this_00 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_28);
      torrent::dec_num_connecting(this_00,this->m_peer_info);
    }
    (this->super_peer_connection_hot_members).field_0x28 =
         (this->super_peer_connection_hot_members).field_0x28 & 0xfd;
  }
  if (((this->super_peer_connection_hot_members).field_0x28 & 1) == 0) {
    bVar3 = boost::system::error_code::operator_cast_to_bool
                      ((error_code *)
                       t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
    if (bVar3) {
      connect_failed(this,(error_code *)
                          t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi);
    }
    else {
      *(ushort *)&this->field_0x885 = *(ushort *)&this->field_0x885 & 0xff7f | 0x80;
      counters::inc_stats_counter(this->m_counters,0xe6,1);
      if (((this->super_peer_connection_hot_members).field_0x28 & 1) == 0) {
        reference.__d.__r = (duration)(this->m_connect).__d.__r;
        ec.cat_ = (error_category *)time_now();
        relative_time::set(&this->m_last_receive,reference,(time_point)ec.cat_);
        boost::system::error_code::error_code((error_code *)local_58);
        polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
        ::local_endpoint(&local_74,&this->m_socket,(error_code *)local_58);
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::operator=(&this->m_local,&local_74);
        bVar3 = boost::system::error_code::operator_cast_to_bool((error_code *)local_58);
        if (bVar3) {
          local_75 = 0;
          (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_58,4,0);
        }
        else {
          session_settings::get_str_abi_cxx11_
                    ((this->super_peer_connection_hot_members).m_settings,4);
          uVar5 = ::std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            psVar1 = (this->super_peer_connection_hot_members).m_ses;
            boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(&local_98,&this->m_local)
            ;
            bVar3 = is_utp(&this->m_socket);
            iVar4 = (*(psVar1->super_session_logger)._vptr_session_logger[0x26])
                              (psVar1,&local_98,(ulong)bVar3,local_58);
            if ((((byte)iVar4 ^ 0xff) & 1) != 0) {
              bVar3 = boost::system::error_code::operator_cast_to_bool((error_code *)local_58);
              if (bVar3) {
                local_99 = 0;
                (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_58,0x12,0)
                ;
              }
              else {
                cat = boost::system::generic_category();
                boost::system::error_code::error_code(&local_b0,0x13,cat);
                local_b1 = 0;
                (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                          (this,&local_b0,0x10,0);
              }
              goto LAB_00456fa2;
            }
          }
          bVar3 = is_utp(&this->m_socket);
          if ((bVar3) && (this->m_peer_info != (torrent_peer *)0x0)) {
            *(uint *)&this->m_peer_info->field_0x1b =
                 *(uint *)&this->m_peer_info->field_0x1b & 0xdfffffff | 0x20000000;
            *(uint *)&this->m_peer_info->field_0x1b =
                 *(uint *)&this->m_peer_info->field_0x1b & 0xefffffff;
          }
          bVar3 = is_v6<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>(&this->m_remote);
          received_synack(this,bVar3);
          bVar3 = should_log(this,outgoing);
          if (bVar3) {
            print_endpoint_abi_cxx11_(&local_d8,(aux *)&this->m_remote,ep);
            uVar6 = ::std::__cxx11::string::c_str();
            peer_log(this,outgoing,"COMPLETED","ep: %s",uVar6);
            ::std::__cxx11::string::~string((string *)&local_d8);
          }
          peer_log(this,info,"SET_NON_BLOCKING");
          polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
          ::non_blocking(&this->m_socket,true,(error_code *)local_58);
          bVar3 = boost::system::error_code::operator_cast_to_bool((error_code *)local_58);
          if (bVar3) {
            local_d9 = 0;
            (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_58,2,0);
          }
          else {
            polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
            ::local_endpoint(&local_f8,&this->m_socket,(error_code *)local_58);
            bVar3 = boost::asio::ip::operator==(&this->m_remote,&local_f8);
            if (bVar3) {
              boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                        ((error_code *)&value,self_connection,(type *)0x0);
              local_109 = 1;
              (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                        (this,(error_code *)&value,1,1);
            }
            else {
              iVar4 = session_settings::get_int
                                ((this->super_peer_connection_hot_members).m_settings,0x4028);
              if (iVar4 != 0) {
                local_110 = session_settings::get_int
                                      ((this->super_peer_connection_hot_members).m_settings,0x4028);
                set_traffic_class<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>>
                          (&this->m_socket,local_110,(error_code *)local_58);
                bVar3 = boost::system::error_code::operator_cast_to_bool((error_code *)local_58);
                if ((bVar3) && (bVar3 = should_log(this,outgoing), uVar2 = local_110, bVar3)) {
                  boost::system::error_code::message_abi_cxx11_
                            ((string *)&__range2,(error_code *)local_58);
                  uVar6 = ::std::__cxx11::string::c_str();
                  peer_log(this,outgoing,"SET_DSCP","value: %d e: %s",(ulong)uVar2,uVar6);
                  ::std::__cxx11::string::~string((string *)&__range2);
                }
              }
              __end2 = ::std::__cxx11::
                       list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                       ::begin(&this->m_extensions);
              ext = (shared_ptr<libtorrent::peer_plugin> *)
                    ::std::__cxx11::
                    list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                    ::end(&this->m_extensions);
              while (bVar3 = ::std::operator!=(&__end2,(_Self *)&ext), bVar3) {
                this_01 = (__shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)::std::_List_iterator<std::shared_ptr<libtorrent::peer_plugin>_>::
                             operator*(&__end2);
                peVar7 = ::std::
                         __shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->(this_01);
                (*peVar7->_vptr_peer_plugin[5])();
                ::std::_List_iterator<std::shared_ptr<libtorrent::peer_plugin>_>::operator++
                          (&__end2);
              }
              (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2e])();
              if ((*(ushort *)&this->field_0x885 >> 0xd & 1) != 0) {
                this->field_0x886 = this->field_0x886 & 0xdf;
                send_block_requests_impl(this);
              }
              setup_receive(this);
              setup_send(this);
            }
          }
        }
      }
    }
  }
LAB_00456fa2:
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_28);
  return;
}

Assistant:

void peer_connection::on_connection_complete(error_code const& e)
	{
		TORRENT_ASSERT(is_single_thread());
		COMPLETE_ASYNC("peer_connection::on_connection_complete");

		INVARIANT_CHECK;

		// if t is nullptr, we better not be connecting, since
		// we can't decrement the connecting counter
		auto t = m_torrent.lock();
		TORRENT_ASSERT(t || !m_connecting);
		if (m_connecting)
		{
			m_counters.inc_stats_counter(counters::num_peers_half_open, -1);
			if (t) t->dec_num_connecting(m_peer_info);
			m_connecting = false;
		}

		if (m_disconnecting) return;

		if (e)
		{
			connect_failed(e);
			return;
		}

		TORRENT_ASSERT(!m_connected);
		m_connected = true;
		m_counters.inc_stats_counter(counters::num_peers_connected);

		if (m_disconnecting) return;
		m_last_receive.set(m_connect, aux::time_now());

		error_code ec;
		m_local = m_socket.local_endpoint(ec);
		if (ec)
		{
			disconnect(ec, operation_t::getname);
			return;
		}

		// if there are outgoing interfaces specified, verify this
		// peer is correctly bound to one of them
		if (!m_settings.get_str(settings_pack::outgoing_interfaces).empty())
		{
			if (!m_ses.verify_bound_address(m_local.address()
				, is_utp(m_socket), ec))
			{
				if (ec)
				{
					disconnect(ec, operation_t::get_interface);
					return;
				}
				disconnect(error_code(
					boost::system::errc::no_such_device, generic_category())
					, operation_t::connect);
				return;
			}
		}

		if (is_utp(m_socket) && m_peer_info)
		{
			m_peer_info->confirmed_supports_utp = true;
			m_peer_info->supports_utp = false;
		}

		// this means the connection just succeeded

		received_synack(aux::is_v6(m_remote));

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing))
		{
			peer_log(peer_log_alert::outgoing, "COMPLETED"
				, "ep: %s", print_endpoint(m_remote).c_str());
		}
#endif

		// set the socket to non-blocking, so that we can
		// read the entire buffer on each read event we get
#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::info, "SET_NON_BLOCKING");
#endif
		m_socket.non_blocking(true, ec);
		if (ec)
		{
			disconnect(ec, operation_t::iocontrol);
			return;
		}

		if (m_remote == m_socket.local_endpoint(ec)
#if TORRENT_USE_RTC
			// WebRTC connections are independant from the socket (their endpoints are not reliable anyway)
			&& !is_rtc(m_socket)
#endif
		)
		{
			disconnect(errors::self_connection, operation_t::bittorrent, failure);
			return;
		}

		if (m_settings.get_int(settings_pack::peer_dscp) != 0)
		{
			int const value = m_settings.get_int(settings_pack::peer_dscp);
			aux::set_traffic_class(m_socket, value, ec);
#ifndef TORRENT_DISABLE_LOGGING
			if (ec && should_log(peer_log_alert::outgoing))
			{
				peer_log(peer_log_alert::outgoing, "SET_DSCP", "value: %d e: %s"
					, value, ec.message().c_str());
			}
#endif
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& ext : m_extensions)
		{
			ext->on_connected();
		}
#endif

		on_connected();

		if (m_deferred_send_block_requests)
		{
			m_deferred_send_block_requests = false;
			send_block_requests_impl();
		}

		setup_receive();
		setup_send();
	}